

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O2

void sysbvm_identitySet_increaseCapacity(sysbvm_context_t *context,sysbvm_tuple_t set)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  intptr_t iVar3;
  size_t i;
  sysbvm_tuple_t sVar4;
  ulong uVar5;
  size_t i_1;
  sysbvm_tuple_t sVar6;
  ulong uVar7;
  
  uVar1 = *(ulong *)(set + 0x18);
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    uVar5 = (ulong)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  else {
    uVar5 = 0;
  }
  uVar7 = (ulong)(uint)((int)uVar5 * 2);
  sVar6 = 8;
  if (8 < uVar7) {
    sVar6 = uVar7;
  }
  sVar2 = sysbvm_array_create(context,sVar6);
  *(sysbvm_tuple_t *)(set + 0x18) = sVar2;
  for (sVar4 = 0; sVar6 != sVar4; sVar4 = sVar4 + 1) {
    *(undefined8 *)(sVar2 + 0x10 + sVar4 * 8) = 0x3f;
  }
  for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    sVar6 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar7 * 8);
    if (sVar6 != 0x3f) {
      iVar3 = sysbvm_identitySet_scanFor(set,sVar6);
      if (iVar3 < 0) {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/set.c:109: assertion failure: elementIndex >= 0"
                  );
      }
      *(sysbvm_tuple_t *)(*(long *)(set + 0x18) + 0x10 + iVar3 * 8) = sVar6;
    }
  }
  return;
}

Assistant:

static void sysbvm_identitySet_increaseCapacity(sysbvm_context_t *context, sysbvm_tuple_t set)
{
    sysbvm_identitySet_t *setObject = (sysbvm_identitySet_t*)set;
    sysbvm_array_t *oldStorage = (sysbvm_array_t*)setObject->storage;

    size_t oldCapacity = sysbvm_tuple_getSizeInSlots(setObject->storage);
    size_t newCapacity = oldCapacity * 2;
    if(newCapacity < 8)
        newCapacity = 8;

    // Make the new storage.
    sysbvm_array_t *newStorage = (sysbvm_array_t*)sysbvm_array_create(context, newCapacity);
    setObject->storage = (sysbvm_tuple_t)newStorage;
    for(size_t i = 0; i < newCapacity; ++i)
        newStorage->elements[i] = SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE;

    // Reinsert the old elements.
    for(size_t i = 0; i < oldCapacity; ++i)
    {
        sysbvm_tuple_t element = oldStorage->elements[i];
        if(element != SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE)
            sysbvm_identitySet_insertNoCheck(set, element);
    }
}